

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_save_simple_key(yaml_parser_t *parser)

{
  int iVar1;
  bool local_49;
  undefined4 local_48;
  uint local_44;
  yaml_simple_key_t simple_key;
  int required;
  yaml_parser_t *parser_local;
  
  local_49 = false;
  if (parser->flow_level == 0) {
    local_49 = (long)parser->indent == (parser->mark).column;
  }
  local_44 = (uint)local_49;
  simple_key.mark.column._4_4_ = local_44;
  if ((parser->simple_key_allowed == 0) && (local_44 != 0)) {
    __assert_fail("parser->simple_key_allowed || !required",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/yaml/src/scanner.c"
                  ,0x459,"int yaml_parser_save_simple_key(yaml_parser_t *)");
  }
  if (parser->simple_key_allowed != 0) {
    local_48 = 1;
    simple_key._0_8_ =
         parser->tokens_parsed + ((long)(parser->tokens).tail - (long)(parser->tokens).head) / 0x50;
    simple_key.token_number = (parser->mark).index;
    simple_key.mark.index = (parser->mark).line;
    simple_key.mark.line = (parser->mark).column;
    iVar1 = yaml_parser_remove_simple_key(parser);
    if (iVar1 == 0) {
      return 0;
    }
    memcpy((parser->simple_keys).top + -1,&local_48,0x28);
  }
  return 1;
}

Assistant:

static int
yaml_parser_save_simple_key(yaml_parser_t *parser)
{
    /*
     * A simple key is required at the current position if the scanner is in
     * the block context and the current column coincides with the indentation
     * level.
     */

    int required = (!parser->flow_level
            && parser->indent == (ptrdiff_t)parser->mark.column);

    /*
     * A simple key is required only when it is the first token in the current
     * line.  Therefore it is always allowed.  But we add a check anyway.
     */

    assert(parser->simple_key_allowed || !required);    /* Impossible. */

    /*
     * If the current position may start a simple key, save it.
     */

    if (parser->simple_key_allowed)
    {
        yaml_simple_key_t simple_key;
        simple_key.possible = 1;
        simple_key.required = required;
        simple_key.token_number = 
            parser->tokens_parsed + (parser->tokens.tail - parser->tokens.head);
        simple_key.mark = parser->mark;

        if (!yaml_parser_remove_simple_key(parser)) return 0;

        *(parser->simple_keys.top-1) = simple_key;
    }

    return 1;
}